

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O0

int ReadImageInfo(VP8LBitReader *br,int *width,int *height,int *has_alpha)

{
  uint32_t uVar1;
  uint32_t *in_RCX;
  int *in_RDX;
  VP8LBitReader *in_RSI;
  long in_RDI;
  int n_bits;
  uint local_4;
  
  n_bits = (int)((ulong)in_RDX >> 0x20);
  uVar1 = VP8LReadBits(in_RSI,n_bits);
  if (uVar1 == 0x2f) {
    uVar1 = VP8LReadBits(in_RSI,n_bits);
    *(uint32_t *)&in_RSI->val_ = uVar1 + 1;
    uVar1 = VP8LReadBits(in_RSI,n_bits);
    *in_RDX = uVar1 + 1;
    uVar1 = VP8LReadBits(in_RSI,n_bits);
    *in_RCX = uVar1;
    uVar1 = VP8LReadBits(in_RSI,n_bits);
    if (uVar1 == 0) {
      local_4 = (uint)((*(int *)(in_RDI + 0x24) != 0 ^ 0xffU) & 1);
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int ReadImageInfo(VP8LBitReader* const br,
                         int* const width, int* const height,
                         int* const has_alpha) {
  if (VP8LReadBits(br, 8) != VP8L_MAGIC_BYTE) return 0;
  *width = VP8LReadBits(br, VP8L_IMAGE_SIZE_BITS) + 1;
  *height = VP8LReadBits(br, VP8L_IMAGE_SIZE_BITS) + 1;
  *has_alpha = VP8LReadBits(br, 1);
  if (VP8LReadBits(br, VP8L_VERSION_BITS) != 0) return 0;
  return !br->eos_;
}